

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindVertexBuffersTest::iterate(FunctionalBindVertexBuffersTest *this)

{
  ostringstream *this_00;
  ulong uVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_01;
  uint uVar6;
  GLuint GVar7;
  long lVar8;
  GLint i;
  long lVar9;
  ulong uVar10;
  GLint i_1;
  GLint max_buffers;
  GLuint vao;
  vector<int,_std::allocator<int>_> strides;
  vector<long,_std::allocator<long>_> offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_buffer_ids;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> buffer;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  max_buffers = 0;
  (**(code **)(lVar5 + 0x868))(0x82da,&max_buffers);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xca9);
  buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::resize
            (&buffer,(long)max_buffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&buffer_ids,(long)max_buffers);
  std::vector<long,_std::allocator<long>_>::resize(&offsets,(long)max_buffers);
  std::vector<int,_std::allocator<int>_>::resize(&strides,(long)max_buffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&t_buffer_ids,(long)max_buffers);
  lVar8 = 0;
  for (lVar9 = 0; lVar9 < max_buffers; lVar9 = lVar9 + 1) {
    MultiBind::Buffer::InitData
              ((Buffer *)
               ((long)&(buffer.
                        super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar8),
               (this->super_TestCase).m_context,0x8892,0x88ea,0x10,(GLvoid *)0x0);
    buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar9] =
         *(uint *)((long)&(buffer.
                           super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar8);
    offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
    [lVar9] = 4;
    strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar9] = 4;
    t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar9] = 0;
    lVar8 = lVar8 + 0x18;
  }
  vao = 0;
  uVar6 = 1;
  (**(code **)(lVar5 + 0x708))(1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcc5);
  (**(code **)(lVar5 + 0xd8))(vao);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcc9);
  (**(code **)(lVar5 + 0xe8))
            (0,max_buffers,
             buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_start,
             strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xccf);
  for (lVar8 = 0; lVar8 < max_buffers; lVar8 = lVar8 + 1) {
    checkVertexAttribBinding
              ((this->super_TestCase).m_context,(GLuint)lVar8,
               buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8]);
  }
  uVar1 = (long)max_buffers / 2;
  iVar3 = (int)uVar1;
  (**(code **)(lVar5 + 0xe8))
            (0,uVar1 & 0xffffffff,
             t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_start,
             strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcdd);
  uVar10 = 0;
  GVar7 = 0;
  if (0 < iVar3) {
    uVar10 = uVar1 & 0xffffffff;
    GVar7 = 0;
  }
  for (; (GLuint)uVar10 != GVar7; GVar7 = GVar7 + 1) {
    checkVertexAttribBinding((this->super_TestCase).m_context,GVar7,0);
  }
  for (lVar8 = (long)iVar3; lVar8 < max_buffers; lVar8 = lVar8 + 1) {
    checkVertexAttribBinding
              ((this->super_TestCase).m_context,(GLuint)lVar8,
               buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8]);
  }
  (**(code **)(lVar5 + 0xe8))
            (uVar1 & 0xffffffff,max_buffers - iVar3,0,
             offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_start,
             strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcee);
  for (GVar7 = 0; (int)GVar7 < max_buffers; GVar7 = GVar7 + 1) {
    checkVertexAttribBinding((this->super_TestCase).m_context,GVar7,0);
  }
  while( true ) {
    cVar2 = (**(code **)(lVar5 + 0xc68))(uVar6);
    if (cVar2 != '\x01') break;
    uVar6 = uVar6 + 1;
  }
  *buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uVar6;
  (**(code **)(lVar5 + 0xe8))
            (0,max_buffers,
             buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_start,
             strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  local_1c0.m_value = (**(code **)(lVar5 + 0x800))();
  if (local_1c0.m_value == 0x502) {
    checkVertexAttribBinding((this->super_TestCase).m_context,0,0);
    for (lVar8 = 1; lVar8 < max_buffers; lVar8 = lVar8 + 1) {
      checkVertexAttribBinding
                ((this->super_TestCase).m_context,(GLuint)lVar8,
                 buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8]);
    }
    (**(code **)(lVar5 + 0xe8))
              (0,(long)max_buffers,0,
               offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"BindVertexBuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xd12);
    (**(code **)(lVar5 + 0x490))(1,&vao);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"DeleteVertexArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xd1c);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&strides.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&offsets.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::~vector
              (&buffer);
    return STOP;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"File: ");
  std::operator<<((ostream *)this_00,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 );
  std::operator<<((ostream *)this_00,", line: ");
  std::ostream::operator<<(this_00,0xd08);
  std::operator<<((ostream *)this_00,". Got wrong error: ");
  local_1c0.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", expected: ");
  local_1d0.m_getName = glu::getErrorName;
  local_1d0.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", message: ");
  std::operator<<((ostream *)this_00,"BindVertexBuffers with invalid id");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xd08);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindVertexBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	static const GLintptr buffer_size = 16;
	static const GLintptr offset	  = 4;
	static const GLsizei  stride	  = 4;

	GLuint invalid_id  = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_buffers = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	std::vector<Buffer>   buffer;
	std::vector<GLuint>   buffer_ids;
	std::vector<GLintptr> offsets;
	std::vector<GLsizei>  strides;
	std::vector<GLuint>   t_buffer_ids;

	buffer.resize(max_buffers);
	buffer_ids.resize(max_buffers);
	offsets.resize(max_buffers);
	strides.resize(max_buffers);
	t_buffer_ids.resize(max_buffers);

	/* Prepare buffers */
	for (GLint i = 0; i < max_buffers; ++i)
	{
		buffer[i].InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		buffer_ids[i]   = buffer[i].m_id;
		offsets[i]		= offset;
		strides[i]		= stride;
		t_buffer_ids[i] = 0;
	}

	GLuint vao = 0;
	gl.genVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");
	try
	{
		gl.bindVertexArray(vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArrays");

		/* - execute BindVertexBuffers to bind all buffer;
		 * - inspect bindings to verify that proper buffers were set;
		 */
		gl.bindVertexBuffers(0, max_buffers, &buffer_ids[0], &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - execute BindVertexBuffers for first half of bindings with <buffers> filled
		 * with zeros, to unbind those buffers;
		 * - inspect bindings to verify that proper buffers were unbound;
		 */
		GLint half_index = max_buffers / 2;

		gl.bindVertexBuffers(0, half_index, &t_buffer_ids[0], &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < half_index; ++i)
		{
			checkVertexAttribBinding(m_context, i, 0);
		}

		for (GLint i = half_index; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - execute BindVertexBuffers for second half of bindings with NULL as
		 * <buffers>, to unbind those buffers;
		 * - inspect bindings to verify that proper buffers were unbound;
		 */
		gl.bindVertexBuffers(half_index, max_buffers - half_index, 0, &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, 0);
		}

		/* - modify <buffers> so first entry is invalid;
		 * - execute BindVertexBuffers to bind all buffers; It is expected that
		 * INVALID_OPERATION will be generated;
		 * - inspect bindings to verify that proper buffers were set;
		 */

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isBuffer(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		buffer_ids[0] = invalid_id;
		gl.bindVertexBuffers(0, max_buffers, &buffer_ids[0], &offsets[0], &strides[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindVertexBuffers with invalid id");

		checkVertexAttribBinding(m_context, 0, 0);
		for (GLint i = 1; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - unbind all buffers. */
		gl.bindVertexBuffers(0, max_buffers, 0, &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");
	}
	catch (const std::exception&)
	{
		gl.deleteVertexArrays(1, &vao);

		TCU_FAIL("Unexpected error generated");
	}

	gl.deleteVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteVertexArrays");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}